

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.cc
# Opt level: O0

void __thiscall
tchecker::parsing::program::parser_t::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,state_type s,symbol_type *that)

{
  symbol_kind_type sVar1;
  symbol_type *that_local;
  state_type s_local;
  stack_symbol_type *this_local;
  
  basic_symbol<tchecker::parsing::program::parser_t::by_state>::basic_symbol
            (&this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>,s,
             &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).location);
  sVar1 = by_kind::kind((by_kind *)that);
  switch(sVar1) {
  case S_TOK_ID:
  case S_TOK_INTEGER:
    value_type::move<std::__cxx11::string>
              (&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value);
    break;
  default:
    break;
  case S_sequence_statement:
  case S_statement:
  case S_if_statement:
  case S_loop_statement:
  case S_local_statement:
  case S_simple_statement:
  case S_assignment:
    value_type::move<std::shared_ptr<tchecker::statement_t>>
              (&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value);
    break;
  case S_conjunctive_formula:
  case S_non_atomic_conjunctive_formula:
  case S_atomic_formula:
  case S_predicate_formula:
  case S_binary_formula:
  case S_term:
    value_type::move<std::shared_ptr<tchecker::expression_t>>
              (&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value);
    break;
  case S_predicate_operator:
    value_type::move<tchecker::binary_operator_t>
              (&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value);
    break;
  case S_lvalue_term:
    value_type::move<std::shared_ptr<tchecker::lvalue_expression_t>>
              (&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value);
    break;
  case S_variable_term:
    value_type::move<std::shared_ptr<tchecker::var_expression_t>>
              (&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value);
    break;
  case S_integer:
    value_type::move<int>
              (&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value);
  }
  (that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).super_by_kind.kind_ =
       S_YYEMPTY;
  return;
}

Assistant:

parser_t::stack_symbol_type::stack_symbol_type (state_type s, YY_MOVE_REF (symbol_type) that)
    : super_type (s, YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_predicate_operator: // predicate_operator
        value.move< enum tchecker::binary_operator_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_conjunctive_formula: // conjunctive_formula
      case symbol_kind::S_non_atomic_conjunctive_formula: // non_atomic_conjunctive_formula
      case symbol_kind::S_atomic_formula: // atomic_formula
      case symbol_kind::S_predicate_formula: // predicate_formula
      case symbol_kind::S_binary_formula: // binary_formula
      case symbol_kind::S_term: // term
        value.move< std::shared_ptr<tchecker::expression_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_lvalue_term: // lvalue_term
        value.move< std::shared_ptr<tchecker::lvalue_expression_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_sequence_statement: // sequence_statement
      case symbol_kind::S_statement: // statement
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_loop_statement: // loop_statement
      case symbol_kind::S_local_statement: // local_statement
      case symbol_kind::S_simple_statement: // simple_statement
      case symbol_kind::S_assignment: // assignment
        value.move< std::shared_ptr<tchecker::statement_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_variable_term: // variable_term
        value.move< std::shared_ptr<tchecker::var_expression_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer"
        value.move< std::string > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_integer: // integer
        value.move< tchecker::integer_t > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

    // that is emptied.
    that.kind_ = symbol_kind::S_YYEMPTY;
  }